

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O3

int Div_FindDiv(Vec_Int_t *vA,Vec_Int_t *vB,int *pLitsA,int *pLitsB)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  
  piVar9 = vA->pArray;
  iVar4 = vA->nSize;
  piVar2 = piVar9 + iVar4;
  piVar8 = vB->pArray;
  iVar5 = vB->nSize;
  piVar3 = piVar8 + iVar5;
  piVar1 = pLitsB + 1;
  pLitsB[0] = -1;
  pLitsB[1] = -1;
  piVar10 = pLitsA + 1;
  pLitsA[0] = -1;
  pLitsA[1] = -1;
  iVar6 = 0;
  if (0 < iVar5 && 0 < (long)iVar4) {
    iVar6 = 0;
    do {
      iVar4 = *piVar9;
      iVar5 = *piVar8;
      if (iVar4 == iVar5) {
        piVar9 = piVar9 + 1;
        piVar8 = piVar8 + 1;
        iVar6 = iVar6 + 1;
      }
      else if (iVar4 < iVar5) {
        piVar7 = pLitsA;
        if ((*pLitsA != -1) && (piVar7 = piVar10, *piVar10 != -1)) {
          return -1;
        }
        piVar9 = piVar9 + 1;
        *piVar7 = iVar4;
      }
      else {
        piVar7 = pLitsB;
        if ((*pLitsB != -1) && (piVar7 = piVar1, *piVar1 != -1)) {
          return -1;
        }
        piVar8 = piVar8 + 1;
        *piVar7 = iVar5;
      }
    } while ((piVar9 < piVar2) && (piVar8 < piVar3));
  }
  while( true ) {
    if (piVar2 <= piVar9) {
      while( true ) {
        if (piVar3 <= piVar8) {
          return iVar6;
        }
        iVar4 = *piVar8;
        piVar10 = pLitsB;
        if ((*pLitsB != -1) && (piVar10 = piVar1, *piVar1 != -1)) break;
        piVar8 = piVar8 + 1;
        *piVar10 = iVar4;
      }
      return -1;
    }
    iVar4 = *piVar9;
    piVar7 = pLitsA;
    if ((*pLitsA != -1) && (piVar7 = piVar10, *piVar10 != -1)) break;
    piVar9 = piVar9 + 1;
    *piVar7 = iVar4;
  }
  return -1;
}

Assistant:

int Div_FindDiv( Vec_Int_t * vA, Vec_Int_t * vB, int pLitsA[2], int pLitsB[2] )
{
    int Counter = 0;
    int * pBegA = vA->pArray, * pEndA = vA->pArray + vA->nSize;
    int * pBegB = vB->pArray, * pEndB = vB->pArray + vB->nSize; 
    pLitsA[0] = pLitsA[1] = pLitsB[0] = pLitsB[1] = -1;
    while ( pBegA < pEndA && pBegB < pEndB )
    {
        if ( *pBegA == *pBegB )
            pBegA++, pBegB++, Counter++;
        else if ( *pBegA < *pBegB )
        {
            if ( Div_AddLit( *pBegA++, pLitsA ) )
                return -1;
        }
        else  
        {
            if ( Div_AddLit( *pBegB++, pLitsB ) )
                return -1;
        }
    }
    while ( pBegA < pEndA )
        if ( Div_AddLit( *pBegA++, pLitsA ) )
            return -1;
    while ( pBegB < pEndB )
        if ( Div_AddLit( *pBegB++, pLitsB ) )
            return -1;
    return Counter;
}